

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O1

QSslCipher __thiscall
QTlsBackend::createCiphersuite
          (QTlsBackend *this,QString *descriptionOneLine,int bits,int supportedBits)

{
  QStringView *pQVar1;
  long lVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  long lVar5;
  int *piVar6;
  char cVar7;
  undefined1 uVar8;
  CutResult CVar9;
  undefined4 uVar10;
  qsizetype qVar11;
  QChar *pQVar12;
  long in_FS_OFFSET;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QLatin1String QVar16;
  QStringView QVar17;
  QLatin1String QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QStringView QVar24;
  QString local_78;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QSslCipher::QSslCipher((QSslCipher *)this);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  local_78.d.ptr = (descriptionOneLine->d).ptr;
  local_78.d.d = (Data *)(descriptionOneLine->d).size;
  QStringView::split(&local_58,&local_78,0x20,1,1);
  if (local_48 < (undefined1 *)0x6) goto LAB_001d40ea;
  **(undefined1 **)this = 0;
  QString::QString(&local_78,(QChar *)((longlong *)CONCAT44(uStack_4c,uStack_50))[1],
                   *(longlong *)CONCAT44(uStack_4c,uStack_50));
  lVar2 = *(long *)this;
  pQVar3 = *(QArrayData **)(lVar2 + 8);
  *(Data **)(lVar2 + 8) = local_78.d.d;
  pcVar4 = *(char16_t **)(lVar2 + 0x10);
  *(char16_t **)(lVar2 + 0x10) = local_78.d.ptr;
  qVar11 = *(qsizetype *)(lVar2 + 0x18);
  *(qsizetype *)(lVar2 + 0x18) = local_78.d.size;
  local_78.d.d = (Data *)pQVar3;
  local_78.d.ptr = pcVar4;
  local_78.d.size = qVar11;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  pQVar1 = (QStringView *)(CONCAT44(uStack_4c,uStack_50) + 0x10);
  lVar2 = pQVar1->m_size;
  pQVar12 = *(QChar **)(CONCAT44(uStack_4c,uStack_50) + 0x18);
  QVar13 = *pQVar1;
  QString::QString(&local_78,pQVar12,lVar2);
  lVar5 = *(long *)this;
  pQVar3 = *(QArrayData **)(lVar5 + 0x78);
  pcVar4 = *(char16_t **)(lVar5 + 0x80);
  *(Data **)(lVar5 + 0x78) = local_78.d.d;
  *(char16_t **)(lVar5 + 0x80) = local_78.d.ptr;
  qVar11 = *(qsizetype *)(lVar5 + 0x88);
  *(qsizetype *)(lVar5 + 0x88) = local_78.d.size;
  local_78.d.d = (Data *)pQVar3;
  local_78.d.ptr = pcVar4;
  local_78.d.size = qVar11;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  lVar5 = *(long *)this;
  *(undefined4 *)(lVar5 + 0x90) = 0xffffffff;
  QVar17.m_data = L"TLSv1";
  QVar17.m_size = 5;
  cVar7 = QtPrivate::startsWith(QVar13,QVar17,CaseSensitive);
  if (cVar7 == '\0') goto LAB_001d3de2;
  uVar10 = 0;
  if (lVar2 == 5) {
LAB_001d3ddb:
    *(undefined4 *)(lVar5 + 0x90) = uVar10;
  }
  else if (pQVar12[5].ucs == L'.') {
    if (lVar2 == 7) {
      pQVar12 = pQVar12 + 6;
      QVar13.m_data = &pQVar12->ucs;
      QVar13.m_size = 1;
      QVar19.m_data = L"3";
      QVar19.m_size = 1;
      cVar7 = QtPrivate::equalStrings(QVar13,QVar19);
      uVar10 = 0xc;
      if (cVar7 == '\0') {
        QVar14.m_data = &pQVar12->ucs;
        QVar14.m_size = 1;
        QVar20.m_data = L"2";
        QVar20.m_size = 1;
        cVar7 = QtPrivate::equalStrings(QVar14,QVar20);
        uVar10 = 2;
        if (cVar7 == '\0') {
          QVar15.m_data = &pQVar12->ucs;
          QVar15.m_size = 1;
          QVar21.m_data = L"1";
          QVar21.m_size = 1;
          cVar7 = QtPrivate::equalStrings(QVar15,QVar21);
          uVar10 = 1;
          if (cVar7 == '\0') goto LAB_001d3de2;
        }
      }
      goto LAB_001d3ddb;
    }
  }
  else if (lVar2 == 5) goto LAB_001d3ddb;
LAB_001d3de2:
  lVar2 = CONCAT44(uStack_4c,uStack_50);
  pQVar1 = (QStringView *)(lVar2 + 0x20);
  qVar11 = pQVar1->m_size;
  QVar18.m_data = "Kx=";
  QVar18.m_size = 3;
  cVar7 = QtPrivate::startsWith(*pQVar1,QVar18,CaseSensitive);
  if (cVar7 != '\0') {
    local_78.d.d = (Data *)0x3;
    local_40 = -1;
    CVar9 = QtPrivate::QContainerImplHelper::mid(qVar11,(qsizetype *)&local_78,&local_40);
    if (CVar9 == Null) {
      qVar11 = 0;
      pQVar12 = (QChar *)0x0;
    }
    else {
      pQVar12 = (QChar *)((long)local_78.d.d * 2 + *(long *)(lVar2 + 0x28));
      qVar11 = local_40;
    }
    QString::QString(&local_78,pQVar12,qVar11);
    lVar2 = *(long *)this;
    pQVar3 = *(QArrayData **)(lVar2 + 0x28);
    pcVar4 = *(char16_t **)(lVar2 + 0x30);
    *(Data **)(lVar2 + 0x28) = local_78.d.d;
    *(char16_t **)(lVar2 + 0x30) = local_78.d.ptr;
    qVar11 = *(qsizetype *)(lVar2 + 0x38);
    *(qsizetype *)(lVar2 + 0x38) = local_78.d.size;
    local_78.d.d = (Data *)pQVar3;
    local_78.d.ptr = pcVar4;
    local_78.d.size = qVar11;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  lVar2 = CONCAT44(uStack_4c,uStack_50);
  pQVar1 = (QStringView *)(lVar2 + 0x30);
  qVar11 = pQVar1->m_size;
  QVar22.m_data = "Au=";
  QVar22.m_size = 3;
  cVar7 = QtPrivate::startsWith(*pQVar1,QVar22,CaseSensitive);
  if (cVar7 != '\0') {
    local_78.d.d = (Data *)0x3;
    local_40 = -1;
    CVar9 = QtPrivate::QContainerImplHelper::mid(qVar11,(qsizetype *)&local_78,&local_40);
    if (CVar9 == Null) {
      qVar11 = 0;
      pQVar12 = (QChar *)0x0;
    }
    else {
      pQVar12 = (QChar *)((long)local_78.d.d * 2 + *(long *)(lVar2 + 0x38));
      qVar11 = local_40;
    }
    QString::QString(&local_78,pQVar12,qVar11);
    lVar2 = *(long *)this;
    pQVar3 = *(QArrayData **)(lVar2 + 0x40);
    pcVar4 = *(char16_t **)(lVar2 + 0x48);
    *(Data **)(lVar2 + 0x40) = local_78.d.d;
    *(char16_t **)(lVar2 + 0x48) = local_78.d.ptr;
    qVar11 = *(qsizetype *)(lVar2 + 0x50);
    *(qsizetype *)(lVar2 + 0x50) = local_78.d.size;
    local_78.d.d = (Data *)pQVar3;
    local_78.d.ptr = pcVar4;
    local_78.d.size = qVar11;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  lVar2 = CONCAT44(uStack_4c,uStack_50);
  pQVar1 = (QStringView *)(lVar2 + 0x40);
  qVar11 = pQVar1->m_size;
  QVar23.m_data = "Enc=";
  QVar23.m_size = 4;
  cVar7 = QtPrivate::startsWith(*pQVar1,QVar23,CaseSensitive);
  if (cVar7 != '\0') {
    local_78.d.d = (Data *)&DAT_00000004;
    local_40 = -1;
    CVar9 = QtPrivate::QContainerImplHelper::mid(qVar11,(qsizetype *)&local_78,&local_40);
    if (CVar9 == Null) {
      qVar11 = 0;
      pQVar12 = (QChar *)0x0;
    }
    else {
      pQVar12 = (QChar *)((long)local_78.d.d * 2 + *(long *)(lVar2 + 0x48));
      qVar11 = local_40;
    }
    QString::QString(&local_78,pQVar12,qVar11);
    lVar2 = *(long *)this;
    pQVar3 = *(QArrayData **)(lVar2 + 0x58);
    pcVar4 = *(char16_t **)(lVar2 + 0x60);
    *(undefined4 *)(lVar2 + 0x58) = local_78.d.d._0_4_;
    *(undefined4 *)(lVar2 + 0x5c) = local_78.d.d._4_4_;
    *(undefined4 *)(lVar2 + 0x60) = local_78.d.ptr._0_4_;
    *(undefined4 *)(lVar2 + 100) = local_78.d.ptr._4_4_;
    qVar11 = *(qsizetype *)(lVar2 + 0x68);
    *(qsizetype *)(lVar2 + 0x68) = local_78.d.size;
    local_78.d.d = (Data *)pQVar3;
    local_78.d.ptr = pcVar4;
    local_78.d.size = qVar11;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  if ((local_48 < (undefined1 *)0x7) || (*(long *)(CONCAT44(uStack_4c,uStack_50) + 0x60) != 6)) {
    uVar8 = 0;
  }
  else {
    QVar16.m_data = "export";
    QVar16.m_size = 6;
    QVar24.m_data = *(storage_type_conflict **)(CONCAT44(uStack_4c,uStack_50) + 0x68);
    QVar24.m_size = 6;
    uVar8 = QtPrivate::equalStrings(QVar16,QVar24);
  }
  lVar2 = *(long *)this;
  *(undefined1 *)(lVar2 + 0x70) = uVar8;
  *(int *)(lVar2 + 0x24) = bits;
  *(int *)(lVar2 + 0x20) = supportedBits;
LAB_001d40ea:
  piVar6 = (int *)CONCAT44(uStack_54,local_58);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)
         (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)this;
}

Assistant:

QSslCipher QTlsBackend::createCiphersuite(const QString &descriptionOneLine, int bits, int supportedBits)
{
    QSslCipher ciph;

    const auto descriptionList = QStringView{descriptionOneLine}.split(u' ', Qt::SkipEmptyParts);
    if (descriptionList.size() > 5) {
        ciph.d->isNull = false;
        ciph.d->name = descriptionList.at(0).toString();

        QStringView protoString = descriptionList.at(1);
        ciph.d->protocolString = protoString.toString();
        ciph.d->protocol = QSsl::UnknownProtocol;
QT_WARNING_PUSH
QT_WARNING_DISABLE_DEPRECATED
        if (protoString.startsWith(u"TLSv1")) {
            QStringView tail = protoString.sliced(5);
            if (tail.startsWith(u'.')) {
                tail = tail.sliced(1);
                if (tail == u"3")
                    ciph.d->protocol = QSsl::TlsV1_3;
                else if (tail == u"2")
                    ciph.d->protocol = QSsl::TlsV1_2;
                else if (tail == u"1")
                    ciph.d->protocol = QSsl::TlsV1_1;
            } else if (tail.isEmpty()) {
                ciph.d->protocol = QSsl::TlsV1_0;
            }
        }
QT_WARNING_POP

        if (descriptionList.at(2).startsWith("Kx="_L1))
            ciph.d->keyExchangeMethod = descriptionList.at(2).mid(3).toString();
        if (descriptionList.at(3).startsWith("Au="_L1))
            ciph.d->authenticationMethod = descriptionList.at(3).mid(3).toString();
        if (descriptionList.at(4).startsWith("Enc="_L1))
            ciph.d->encryptionMethod = descriptionList.at(4).mid(4).toString();
        ciph.d->exportable = (descriptionList.size() > 6 && descriptionList.at(6) == "export"_L1);

        ciph.d->bits = bits;
        ciph.d->supportedBits = supportedBits;
    }

    return ciph;
}